

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::checkExtension(RenderContext *renderCtx,string *extension)

{
  bool bVar1;
  NotSupportedError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *extension_local;
  RenderContext *renderCtx_local;
  
  local_18 = extension;
  extension_local = (string *)renderCtx;
  bVar1 = isExtensionSupported(renderCtx,extension);
  if (!bVar1) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::operator+(&local_38,local_18," is not supported");
    tcu::NotSupportedError::NotSupportedError(this,&local_38);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  return;
}

Assistant:

static void checkExtension (const glu::RenderContext& renderCtx, const std::string& extension)
{
	if (!isExtensionSupported(renderCtx, extension))
		throw tcu::NotSupportedError(extension + " is not supported");
}